

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

deUint32 __thiscall deqp::gles31::bb::BufferManager::allocBuffer(BufferManager *this)

{
  iterator __position;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint32 buf;
  uint local_1c;
  
  local_1c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->m_buffers,
             ((long)(this->m_buffers).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_buffers).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 1);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6c8))(1,&local_1c);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(err,"Failed to allocate buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0x80f);
  __position._M_current =
       (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_buffers,__position,
               &local_1c);
  }
  else {
    *__position._M_current = local_1c;
    (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return local_1c;
}

Assistant:

deUint32 BufferManager::allocBuffer (void)
{
	deUint32 buf = 0;

	m_buffers.reserve(m_buffers.size()+1);
	m_renderCtx.getFunctions().genBuffers(1, &buf);
	GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "Failed to allocate buffer");
	m_buffers.push_back(buf);

	return buf;
}